

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NonMaximumSuppression::SharedDtor(NonMaximumSuppression *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/NonMaximumSuppression.pb.cc"
               ,0x1bf);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->confidenceinputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->coordinatesinputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->iouthresholdinputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->confidencethresholdinputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->confidenceoutputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->coordinatesoutputfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  if (this->_oneof_case_[0] != 0) {
    clear_SuppressionMethod(this);
  }
  if (this->_oneof_case_[1] != 0) {
    clear_ClassLabels(this);
  }
  return;
}

Assistant:

inline void NonMaximumSuppression::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  confidenceinputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  coordinatesinputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  iouthresholdinputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  confidencethresholdinputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  confidenceoutputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  coordinatesoutputfeaturename_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (has_SuppressionMethod()) {
    clear_SuppressionMethod();
  }
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}